

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_brodnik<unsigned_char_*> *bucket,size_t depth)

{
  uchar **ppuVar1;
  ushort uVar2;
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *this_00;
  uchar *puVar3;
  vector_brodnik<unsigned_char_*> *pvVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint j;
  long lVar9;
  size_t sVar10;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  ushort auStack_2b0 [64];
  undefined8 auStack_230 [64];
  
  this_00 = (TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = ((2L << (bucket->_superblock & 0x3f)) -
          ((ulong)bucket->_left_in_superblock * bucket->_block_size + bucket->_left_in_block)) +
          0xffffffc0;
  uVar7 = 0;
  uVar8 = (uint)uVar6;
  if (0x3f < uVar8) {
    uVar7 = 0;
    do {
      lVar9 = 0;
      do {
        puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,lVar9 + uVar7);
        auStack_230[lVar9] = puVar3;
        if (puVar3 == (uchar *)0x0) goto LAB_001ad235;
        if (puVar3[depth] == '\0') {
          uVar2 = 0;
        }
        else {
          uVar2 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
        }
        auStack_2b0[lVar9] = uVar2;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x40);
      lVar9 = 0;
      do {
        pvVar4 = TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::get_bucket
                           (this_00,(uint)auStack_2b0[lVar9]);
        if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
          __assert_fail("sub_bucket",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                        ,0x78,
                        "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_brodnik<unsigned char *>]"
                       );
        }
        sVar10 = pvVar4->_left_in_block;
        if (sVar10 == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar4);
          sVar10 = pvVar4->_left_in_block;
        }
        puVar3 = (uchar *)auStack_230[lVar9];
        ppuVar1 = pvVar4->_insertpos;
        pvVar4->_insertpos = ppuVar1 + 1;
        *ppuVar1 = puVar3;
        pvVar4->_left_in_block = sVar10 - 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x40);
      uVar7 = uVar7 + 0x40;
    } while (uVar7 < (uVar8 & 0xffffffc0));
  }
  if ((uint)uVar7 < uVar8) {
    sVar10 = uVar7 & 0xffffffff;
    do {
      puVar3 = vector_brodnik<unsigned_char_*>::operator[](bucket,sVar10);
      if (puVar3 == (uchar *)0x0) {
LAB_001ad235:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = (uint)CONCAT11(puVar3[depth],puVar3[depth + 1]);
      }
      pvVar4 = TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::get_bucket(this_00,uVar8)
      ;
      if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x80,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_brodnik<unsigned char *>]"
                     );
      }
      sVar5 = pvVar4->_left_in_block;
      if (sVar5 == 0) {
        vector_brodnik<unsigned_char_*>::grow(pvVar4);
        sVar5 = pvVar4->_left_in_block;
      }
      ppuVar1 = pvVar4->_insertpos;
      pvVar4->_insertpos = ppuVar1 + 1;
      *ppuVar1 = puVar3;
      pvVar4->_left_in_block = sVar5 - 1;
      sVar10 = sVar10 + 1;
    } while (sVar10 < (uVar6 & 0xffffffff));
  }
  return this_00;
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}